

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Tree::lookup_result::unresolved(lookup_result *this)

{
  ulong uVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  csubstr cVar5;
  csubstr local_20;
  
  uVar1 = this->path_pos;
  uVar2 = (this->path).len;
  if (uVar1 <= uVar2) {
    basic_substring<const_char>::basic_substring(&local_20,(this->path).str + uVar1,uVar2 - uVar1);
    return local_20;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar4 = is_debugger_attached();
    if (bVar4) {
      pcVar3 = (code *)swi(3);
      cVar5 = (csubstr)(*pcVar3)();
      return cVar5;
    }
  }
  handle_error(0x24bbea,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

csubstr Tree::lookup_result::unresolved() const
{
    return path.sub(path_pos);
}